

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_i_refvec.h
# Opt level: O0

void __thiscall TNT::i_refvec<int>::destroy(i_refvec<int> *this)

{
  i_refvec<int> *this_local;
  
  if (this->ref_count_ != (int *)0x0) {
    if (this->ref_count_ != (int *)0x0) {
      operator_delete(this->ref_count_,4);
    }
    if ((this->data_ != (int *)0x0) && (this->data_ != (int *)0x0)) {
      operator_delete__(this->data_);
    }
    this->data_ = (int *)0x0;
  }
  return;
}

Assistant:

void i_refvec<T>::destroy()
{
	if (ref_count_ != NULL)
	{
#ifdef TNT_DEBUG
		std::cout << "destorying data... \n";
#endif
		delete ref_count_;

#ifdef TNT_DEBUG
		std::cout << "deleted ref_count_ ...\n";
#endif
		if (data_ != NULL)
			delete []data_;
#ifdef TNT_DEBUG
		std::cout << "deleted data_[] ...\n";
#endif
		data_ = NULL;
	}
}